

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_CutCreateUnit(Lf_Cut_t *p,int i)

{
  word wVar1;
  
  p->iFunc = 2;
  *(uint *)&p->field_0x14 = *(uint *)&p->field_0x14 & 0x3fffff | 0x1000000;
  *(int *)&p[1].Sign = i;
  wVar1 = 1L << ((byte)i & 0x3f);
  p->Sign = wVar1;
  return (int)wVar1;
}

Assistant:

static inline int Lf_CutCreateUnit( Lf_Cut_t * p, int i )
{
    p->fLate = 0;
    p->fMux7 = 0;
    p->iFunc = 2;
    p->nLeaves = 1;
    p->pLeaves[0] = i;
    p->Sign = ((word)1) << (i & 0x3F);
    return 1;
}